

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

Vec_Int_t * Acb_NtkDivisors(Acb_Ntk_t *p,int Pivot,int nTfiLevMin,int fDelay)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vDivs;
  int *piVar3;
  long lVar4;
  
  vDivs = Vec_IntAlloc(100);
  Acb_NtkIncTravId(p);
  Acb_NtkDivisors_rec(p,Pivot,nTfiLevMin,vDivs);
  iVar1 = Vec_IntEntryLast(vDivs);
  if (iVar1 == Pivot) {
    Vec_IntPop(vDivs);
    piVar3 = Acb_ObjFanins(p,Pivot);
    for (lVar4 = 0; lVar4 < *piVar3; lVar4 = lVar4 + 1) {
      iVar1 = piVar3[lVar4 + 1];
      iVar2 = Acb_ObjSetTravIdCur(p,iVar1);
      if (iVar2 == 0) {
        Vec_IntPush(vDivs,iVar1);
      }
    }
    return vDivs;
  }
  __assert_fail("Vec_IntEntryLast(vDivs) == Pivot",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                ,0x1f2,"Vec_Int_t *Acb_NtkDivisors(Acb_Ntk_t *, int, int, int)");
}

Assistant:

Vec_Int_t * Acb_NtkDivisors( Acb_Ntk_t * p, int Pivot, int nTfiLevMin, int fDelay )
{
    int k, iFanin, * pFanins;
    Vec_Int_t * vDivs = Vec_IntAlloc( 100 );
    Acb_NtkIncTravId( p );
//    if ( fDelay ) // delay-oriented
    if ( 0 ) // delay-oriented
    {
        // start from critical fanins
        assert( Acb_ObjLevelD( p, Pivot ) > 1 );
        Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
            if ( Acb_ObjIsDelayCriticalFanin( p, Pivot, iFanin ) )
                Acb_NtkDivisors_rec( p, iFanin, nTfiLevMin, vDivs );
        // add non-critical fanins
        Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
            if ( !Acb_ObjIsDelayCriticalFanin( p, Pivot, iFanin ) )
                if ( !Acb_ObjSetTravIdCur(p, iFanin) )
                    Vec_IntPush( vDivs, iFanin );
    }
    else
    {
        Acb_NtkDivisors_rec( p, Pivot, nTfiLevMin, vDivs );
        assert( Vec_IntEntryLast(vDivs) == Pivot );
        Vec_IntPop( vDivs );
        // add remaining fanins of the node
        Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
            if ( !Acb_ObjSetTravIdCur(p, iFanin) )
                Vec_IntPush( vDivs, iFanin );
/*
        // start from critical fanins
        assert( Acb_ObjLevelD( p, Pivot ) > 1 );
        Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
            if ( Acb_ObjIsAreaCritical( p, iFanin ) )
                Acb_NtkDivisors_rec( p, iFanin, nTfiLevMin, vDivs );
        // add non-critical fanins
        Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
            if ( !Acb_ObjIsAreaCritical( p, iFanin ) )
                if ( !Acb_ObjSetTravIdCur(p, iFanin) )
                    Vec_IntPush( vDivs, iFanin );
*/
    }
    return vDivs;
}